

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::absolute_pose::modules::p3p_kneip_main
               (bearingVectors_t *f,points_t *p,transformations_t *solutions)

{
  undefined1 auVar1 [16];
  pointer pMVar2;
  pointer pMVar3;
  iterator __position;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  SrcEvaluatorType srcEvaluator_1;
  ulong uVar23;
  long lVar24;
  SrcEvaluatorType srcEvaluator;
  ulong uVar25;
  long lVar26;
  int i;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar53;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  double dVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  rotation_t T;
  transformation_t solution;
  rotation_t N;
  DstEvaluatorType dstEvaluator;
  rotation_t R;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  vector<double,_std::allocator<double>_> realRoots;
  type tmp;
  assign_op<double,_double> local_379;
  double local_378;
  undefined1 local_370 [16];
  double local_360 [6];
  undefined8 local_330;
  undefined8 local_328;
  double local_320;
  undefined8 uStack_318;
  double local_310 [2];
  Matrix<double,_3,_4,_0,_3,_4> local_300;
  undefined8 local_2a0;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  double local_270;
  undefined8 uStack_268;
  undefined1 local_260 [16];
  double local_250;
  double dStack_248;
  undefined8 local_240;
  double dStack_238;
  double local_230;
  undefined8 local_228;
  double local_220;
  double dStack_218;
  double local_210;
  double local_208;
  vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
  *local_200;
  double local_1f8;
  double local_1f0;
  plainobjectbase_evaluator_data<double,_3> local_1e8;
  non_const_type local_1e0 [2];
  plainobjectbase_evaluator_data<double,_3> pStack_1d0;
  plainobjectbase_evaluator_data<double,_3> pStack_1c8;
  double dStack_1c0;
  undefined8 uStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double local_1a0;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  double local_170 [4];
  undefined8 local_150;
  vector<double,_std::allocator<double>_> local_148;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_130;
  SrcEvaluatorType local_110;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined1 local_c0 [16];
  ulong local_b0;
  ulong uStack_a8;
  undefined1 local_a0 [16];
  double local_90;
  double dStack_88;
  undefined1 local_80 [16];
  double local_70;
  double dStack_68;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pMVar2 = (p->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = *(undefined1 (*) [16])
              &(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data;
  dVar42 = *(double *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data + 0x10);
  auVar37 = *(undefined1 (*) [16])
             &pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       *(double *)
        ((long)&pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  auVar38 = *(undefined1 (*) [16])
             &pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       *(double *)
        ((long)&pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  auVar29 = vsubpd_avx512vl(auVar37,local_c0);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar42;
  auVar30 = vsubsd_avx512f(auVar90,auVar39);
  auVar31 = vsubpd_avx512vl(auVar38,local_c0);
  auVar32 = vsubsd_avx512f(auVar36,auVar39);
  auVar39 = vshufpd_avx(auVar29,auVar29,1);
  auVar40 = vshufpd_avx(auVar31,auVar31,1);
  dVar53 = auVar30._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar40._0_8_ * dVar53;
  auVar35 = vfmsub231sd_fma(auVar35,auVar39,auVar32);
  dVar54 = auVar29._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar32._0_8_ * dVar54;
  auVar30 = vfmsub231sd_fma(auVar33,auVar30,auVar31);
  auVar35 = vunpcklpd_avx(auVar35,auVar30);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar31._0_8_ * auVar39._0_8_;
  auVar39 = vfmsub231sd_fma(auVar30,auVar29,auVar40);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       auVar39._0_8_ * auVar39._0_8_ + auVar35._0_8_ * auVar35._0_8_ + auVar35._8_8_ * auVar35._8_8_
  ;
  auVar39 = vsqrtsd_avx(auVar40,auVar40);
  if ((auVar39._0_8_ != 0.0) || (NAN(auVar39._0_8_))) {
    pMVar3 = (f->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    auVar40 = *(undefined1 (*) [16])
               &(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data;
    local_320 = *(double *)
                 ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + 0x10);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_320;
    auVar39 = *(undefined1 (*) [16])
               &pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
    dVar82 = *(double *)
              ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data + 0x10);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar82;
    dVar55 = *(double *)
              ((long)(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array + 8);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar55;
    dVar68 = *(double *)
              ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data + 8);
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar68;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = dVar68 * local_320;
    auVar35 = vfmsub231sd_fma(auVar105,auVar69,auVar32);
    auVar111._8_8_ = 0;
    auVar111._0_8_ = dVar82 * auVar40._0_8_;
    auVar30 = vfmsub231sd_fma(auVar111,auVar34,auVar39);
    auVar30 = vunpcklpd_avx(auVar35,auVar30);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = auVar39._0_8_ * dVar55;
    auVar31 = vfmsub231sd_fma(auVar112,auVar40,auVar94);
    dVar68 = auVar31._0_8_;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar68 * dVar68 + auVar30._0_8_ * auVar30._0_8_ + auVar30._8_8_ * auVar30._8_8_;
    auVar35 = vsqrtpd_avx(auVar95);
    dVar55 = auVar35._0_8_;
    auVar120._8_8_ = dVar55;
    auVar120._0_8_ = dVar55;
    auVar35 = vdivpd_avx(auVar30,auVar120);
    auVar96._0_8_ = dVar68 / dVar55;
    auVar96._8_8_ = auVar31._8_8_;
    auVar30 = vshufpd_avx512vl(auVar35,auVar35,1);
    auVar31 = vmulsd_avx512f(auVar69,auVar96);
    auVar32 = vfmsub231sd_avx512f(auVar31,auVar30,auVar34);
    auVar31 = vmulsd_avx512f(auVar34,auVar35);
    auVar33 = vfmsub231sd_avx512f(auVar31,auVar96,auVar40);
    auVar31 = vmulsd_avx512f(auVar40,auVar30);
    auVar34 = vfmsub231sd_avx512f(auVar31,auVar35,auVar69);
    dVar55 = pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[0];
    dVar68 = *(double *)
              ((long)pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 8);
    auVar106._8_8_ = dVar68;
    auVar106._0_8_ = dVar68;
    dVar68 = *(double *)
              ((long)&pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data + 0x10);
    auVar70._8_8_ = dVar68;
    auVar70._0_8_ = dVar68;
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    auVar31 = vmulsd_avx512f(auVar35,auVar31);
    local_360[2] = (double)vmovlpd_avx(auVar40);
    vmovsd_avx512f(auVar32);
    vmovsd_avx512f(auVar33);
    vmovsd_avx512f(auVar34);
    local_360[4] = auVar35._0_8_;
    local_360[5] = auVar40._8_8_;
    local_328 = vmovhpd_avx(auVar35);
    auVar35 = vmulsd_avx512f(auVar106,auVar30);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = auVar35._0_8_ + auVar96._0_8_ * dVar68;
    auVar35 = vaddsd_avx512f(auVar31,auVar97);
    local_378 = auVar35._0_8_;
    if (local_378 <= 0.0) {
      auVar100._0_8_ = dVar55 * local_360[2];
      auVar100._8_8_ = dVar55 * local_360[3];
      auVar13._8_8_ = local_330;
      auVar13._0_8_ = local_360[5];
      auVar35 = vfmadd132pd_fma(auVar106,auVar100,auVar13);
      auVar15._8_8_ = uStack_318;
      auVar15._0_8_ = local_320;
      auVar35 = vfmadd132pd_fma(auVar70,auVar35,auVar15);
      local_310[0] = auVar96._0_8_;
    }
    else {
      auVar40 = *(undefined1 (*) [16])
                 &pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
      local_320 = *(double *)
                   ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data + 0x10);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_320;
      auVar39 = *(undefined1 (*) [16])
                 &(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data;
      dVar82 = *(double *)
                ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + 0x10);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar82;
      dVar42 = *(double *)
                ((long)&pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 8);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar42;
      dVar55 = *(double *)
                ((long)(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array + 8);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = dVar55;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = dVar55 * local_320;
      auVar37 = vfmsub231sd_fma(auVar78,auVar71,auVar38);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = dVar82 * auVar40._0_8_;
      auVar38 = vfmsub231sd_fma(auVar83,auVar61,auVar39);
      auVar38 = vunpcklpd_avx(auVar37,auVar38);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = auVar39._0_8_ * dVar42;
      auVar35 = vfmsub231sd_fma(auVar91,auVar40,auVar73);
      dVar68 = auVar35._0_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ =
           auVar38._0_8_ * auVar38._0_8_ + auVar38._8_8_ * auVar38._8_8_ + dVar68 * dVar68;
      auVar37 = vsqrtpd_avx(auVar74);
      dVar55 = auVar37._0_8_;
      auVar84._8_8_ = dVar55;
      auVar84._0_8_ = dVar55;
      auVar37 = vdivpd_avx(auVar38,auVar84);
      auVar75._0_8_ = dVar68 / dVar55;
      auVar75._8_8_ = auVar35._8_8_;
      auVar38 = vshufpd_avx(auVar37,auVar37,1);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = dVar42 * auVar75._0_8_;
      auVar35 = vfmsub231sd_fma(auVar92,auVar38,auVar61);
      local_360[4] = auVar37._0_8_;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = local_360[4] * local_320;
      auVar30 = vfmsub231sd_fma(auVar98,auVar75,auVar40);
      auVar99._8_8_ = 0;
      auVar99._0_8_ = auVar38._0_8_ * auVar40._0_8_;
      auVar31 = vfmsub231sd_fma(auVar99,auVar37,auVar71);
      dVar42 = pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
      dVar55 = *(double *)
                ((long)pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array + 8);
      auVar107._8_8_ = dVar55;
      auVar107._0_8_ = dVar55;
      dVar68 = *(double *)
                ((long)&pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 0x10);
      auVar113._8_8_ = dVar68;
      auVar113._0_8_ = dVar68;
      local_360[2] = (double)vmovlpd_avx(auVar40);
      local_360[3] = auVar35._0_8_;
      local_330 = auVar30._0_8_;
      uStack_318 = auVar31._0_8_;
      local_360[5] = auVar40._8_8_;
      local_328 = vmovhpd_avx(auVar37);
      auVar72._0_8_ = dVar42 * local_360[2];
      auVar72._8_8_ = dVar42 * local_360[3];
      auVar37._8_8_ = local_330;
      auVar37._0_8_ = local_360[5];
      auVar37 = vfmadd231pd_fma(auVar72,auVar107,auVar37);
      auVar14._8_8_ = uStack_318;
      auVar14._0_8_ = local_320;
      auVar35 = vfmadd231pd_fma(auVar37,auVar113,auVar14);
      local_378 = local_360[4] *
                  pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] + dVar55 * auVar38._0_8_ + dVar68 * auVar75._0_8_;
      local_c0 = *(undefined1 (*) [16])
                  &pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
      dVar42 = *(double *)
                ((long)&pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 0x10);
      auVar37 = *(undefined1 (*) [16])
                 &(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data;
      auVar90._8_8_ = 0;
      auVar90._0_8_ =
           *(double *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data + 0x10);
      auVar38 = *(undefined1 (*) [16])
                 &pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data;
      auVar36._8_8_ = 0;
      auVar36._0_8_ =
           *(double *)
            ((long)&pMVar2[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data + 0x10);
      local_310[0] = auVar75._0_8_;
    }
    auVar30 = vsubpd_avx512vl(auVar37,local_c0);
    auVar126._8_8_ = 0;
    auVar126._0_8_ = dVar42;
    auVar31 = vsubsd_avx512f(auVar90,auVar126);
    dVar55 = auVar31._0_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar55 * dVar55 + auVar30._0_8_ * auVar30._0_8_ + auVar30._8_8_ * auVar30._8_8_;
    auVar37 = vsqrtpd_avx(auVar93);
    dVar68 = auVar37._0_8_;
    auVar101._8_8_ = dVar68;
    auVar101._0_8_ = dVar68;
    auVar37 = vdivpd_avx(auVar30,auVar101);
    auVar85._0_8_ = dVar55 / dVar68;
    auVar85._8_8_ = auVar31._8_8_;
    auVar30 = vshufpd_avx(auVar37,auVar37,1);
    vmovsd_avx512f(auVar126);
    auVar127._8_8_ = 0;
    auVar127._0_8_ = dVar42;
    auVar32 = vsubsd_avx512f(auVar36,auVar127);
    auVar33 = vsubpd_avx512vl(auVar38,local_c0);
    auVar38 = vshufpd_avx(auVar33,auVar33,1);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = auVar38._0_8_ * auVar85._0_8_;
    auVar31 = vfmsub231sd_fma(auVar108,auVar30,auVar32);
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3]
         = auVar32._0_8_;
    auVar114._8_8_ = 0;
    auVar114._0_8_ =
         local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[3] * auVar37._0_8_;
    auVar32 = vfmsub231sd_fma(auVar114,auVar85,auVar33);
    auVar31 = vunpcklpd_avx(auVar31,auVar32);
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = auVar33._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ =
         auVar30._0_8_ *
         local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[1];
    auVar32 = vfmsub231sd_fma(auVar115,auVar37,auVar38);
    dVar55 = auVar32._0_8_;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = dVar55 * dVar55 + auVar31._0_8_ * auVar31._0_8_ + auVar31._8_8_ * auVar31._8_8_
    ;
    auVar38 = vsqrtpd_avx(auVar102);
    dVar42 = auVar38._0_8_;
    auVar121._8_8_ = dVar42;
    auVar121._0_8_ = dVar42;
    auVar38 = vdivpd_avx(auVar31,auVar121);
    auVar103._0_8_ = dVar55 / dVar42;
    auVar103._8_8_ = auVar32._8_8_;
    auVar31 = vshufpd_avx(auVar38,auVar38,1);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = auVar30._0_8_ * auVar103._0_8_;
    auVar32 = vfmsub231sd_fma(auVar122,auVar31,auVar85);
    auVar36 = vmulsd_avx512f(auVar85,auVar38);
    auVar36 = vfmsub231sd_avx512f(auVar36,auVar103,auVar37);
    auVar116._8_8_ = 0;
    auVar116._0_8_ = auVar31._0_8_ * auVar37._0_8_;
    auVar30 = vfmsub231sd_fma(auVar116,auVar38,auVar30);
    local_250 = (double)vmovlpd_avx(auVar37);
    dStack_248 = auVar32._0_8_;
    vmovsd_avx512f(auVar36);
    dStack_218 = auVar30._0_8_;
    dStack_238 = auVar37._8_8_;
    local_240 = auVar38._0_8_;
    local_228 = vmovhpd_avx(auVar38);
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = auVar33._8_8_;
    auVar64._0_8_ =
         local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[1] * local_250;
    auVar64._8_8_ =
         local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[1] * dStack_248;
    auVar21._8_8_ = local_230;
    auVar21._0_8_ = dStack_238;
    auVar6._8_8_ = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2];
    auVar6._0_8_ = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2];
    auVar37 = vfmadd132pd_avx512vl(auVar21,auVar64,auVar6);
    auVar65._8_8_ =
         local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[3];
    auVar65._0_8_ =
         local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[3];
    auVar22._8_8_ = dStack_218;
    auVar22._0_8_ = auVar85._0_8_;
    local_290 = vfmadd132pd_fma(auVar65,auVar37,auVar22);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar53 * dVar53 + dVar54 * dVar54 + auVar29._8_8_ * auVar29._8_8_;
    local_260 = vsqrtpd_avx(auVar43);
    local_360[0] = auVar35._0_8_ / local_378;
    local_360[1] = auVar35._8_8_;
    auVar37 = vshufpd_avx(auVar35,auVar35,1);
    local_378 = auVar37._0_8_ / local_378;
    local_190 = vshufpd_avx(local_290,local_290,1);
    dVar42 = dVar82 * local_320 + auVar39._0_8_ * auVar40._0_8_ + auVar39._8_8_ * auVar40._8_8_;
    dVar53 = 1.0 / (1.0 - dVar42 * dVar42) + -1.0;
    local_220 = auVar85._0_8_;
    local_210 = auVar103._0_8_;
    local_200 = (vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                 *)solutions;
    if (dVar53 < 0.0) {
      local_370._8_8_ = local_370._0_8_;
      local_370._0_8_ = dVar42;
      auVar49._0_8_ = sqrt(dVar53);
      auVar49._8_56_ = extraout_var;
      auVar37 = auVar49._0_16_;
    }
    else {
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar53;
      auVar37 = vsqrtsd_avx(auVar29,auVar29);
      local_370._0_8_ = dVar42;
    }
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_370._0_8_;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar38 = vxorpd_avx512vl(auVar37,auVar7);
    uVar4 = vcmpsd_avx512f(auVar56,ZEXT816(0) << 0x40,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_370._0_8_ = (ulong)bVar5 * auVar38._0_8_ + (ulong)!bVar5 * auVar37._0_8_;
    local_370._8_8_ = auVar37._8_8_;
    auVar11._8_8_ = local_360[1];
    auVar11._0_8_ = local_360[0];
    auVar38 = vmulsd_avx512f(auVar11,auVar11);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = local_378;
    auVar39 = vmulsd_avx512f(auVar124,auVar124);
    auVar40 = vmulsd_avx512f(local_290,local_290);
    auVar35 = vmulsd_avx512f(local_290,auVar40);
    auVar30 = vmulsd_avx512f(local_290,auVar35);
    auVar29 = vmulsd_avx512f(local_190,local_190);
    auVar31 = vmulsd_avx512f(local_190,auVar29);
    auVar32 = vmulsd_avx512f(local_190,auVar31);
    auVar33 = vmulsd_avx512f(local_260,local_260);
    auVar37 = vmulsd_avx512f(auVar38,auVar32);
    auVar37 = vfnmsub231sd_fma(auVar37,auVar39,auVar32);
    local_170[0] = auVar37._0_8_ - auVar32._0_8_;
    dVar42 = auVar31._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar42 + dVar42;
    auVar37 = vmulsd_avx512f(local_260,auVar76);
    dVar82 = auVar39._0_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = dVar42 * (dVar82 + dVar82);
    auVar31 = vmulsd_avx512f(local_260,auVar104);
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auVar31._0_8_ * (double)local_370._0_8_;
    auVar37 = vfmadd231sd_fma(auVar109,local_370,auVar37);
    auVar125._8_8_ = 0;
    auVar125._0_8_ = local_378;
    auVar36 = vaddsd_avx512f(auVar125,auVar125);
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auVar36._0_8_ * dVar42;
    auVar36 = vmulsd_avx512f(auVar11,auVar79);
    auVar37 = vfnmadd231sd_avx512f(auVar37,auVar36,local_260);
    local_170[1] = auVar37._0_8_;
    dVar55 = auVar29._0_8_;
    dVar68 = auVar33._0_8_;
    dVar42 = dVar82 * dVar55 * dVar68;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = dVar82 * dVar55;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = dVar42 * (double)local_370._0_8_ * (double)local_370._0_8_;
    auVar37 = vfnmsub231sd_fma(auVar117,auVar110,auVar40);
    auVar37 = vfnmadd231sd_fma(auVar37,auVar110,auVar33);
    auVar37 = vfmadd231sd_fma(auVar37,auVar39,auVar32);
    auVar37 = vfmadd231sd_avx512f(auVar37,auVar38,auVar32);
    auVar39 = vaddsd_avx512f(local_290,local_290);
    dVar53 = auVar39._0_8_ * dVar55;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = dVar53;
    auVar37 = vfmadd231sd_avx512f(auVar37,auVar123,local_260);
    auVar32 = vaddsd_avx512f(auVar11,auVar11);
    auVar32 = vmulsd_avx512f(auVar32,auVar125);
    auVar32 = vmulsd_avx512f(local_290,auVar32);
    auVar32 = vmulsd_avx512f(auVar29,auVar32);
    auVar32 = vmulsd_avx512f(local_260,auVar32);
    auVar37 = vfmadd213sd_avx512f(auVar32,local_370,auVar37);
    dVar54 = auVar40._0_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = dVar54 * dVar55;
    auVar37 = vfnmadd213sd_avx512f(auVar118,auVar38,auVar37);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = dVar53 * dVar82;
    auVar37 = vfmadd213sd_avx512f(auVar86,local_260,auVar37);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = (double)local_370._0_8_ * (double)local_370._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = dVar68 * dVar55;
    auVar37 = vfnmadd213sd_fma(auVar119,auVar58,auVar37);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = dVar54 + dVar54;
    auVar37 = vfnmadd231sd_fma(auVar37,auVar87,auVar29);
    local_170[2] = auVar37._0_8_;
    auVar37 = vmulsd_avx512f(local_190,auVar87);
    auVar37 = vmulsd_avx512f(local_260,auVar37);
    auVar32 = vmulsd_avx512f(local_260,auVar36);
    auVar37 = vfmadd231sd_fma(auVar32,local_370,auVar37);
    auVar37 = vfnmadd231sd_fma(auVar37,local_370,auVar31);
    auVar39 = vmulsd_avx512f(local_190,auVar39);
    auVar88._8_8_ = 0;
    auVar88._0_8_ = auVar39._0_8_ * dVar68;
    auVar37 = vfnmadd213sd_fma(auVar88,local_370,auVar37);
    local_170[3] = auVar37._0_8_;
    auVar37 = vmulsd_avx512f(auVar125,ZEXT816(0xc000000000000000));
    auVar89._8_8_ = 0;
    auVar89._0_8_ = auVar37._0_8_ * dVar55;
    auVar37 = vmulsd_avx512f(auVar11,auVar89);
    auVar37 = vmulsd_avx512f(local_290,auVar37);
    auVar37 = vmulsd_avx512f(local_260,auVar37);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar42;
    auVar37 = vfmadd213sd_fma(auVar37,local_370,auVar80);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auVar35._0_8_ + auVar35._0_8_;
    auVar37 = vfmadd213sd_avx512f(auVar66,local_260,auVar37);
    auVar37 = vfnmadd231sd_fma(auVar37,auVar40,auVar33);
    auVar37 = vfmadd231sd_fma(auVar37,auVar40,auVar110);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar55 * (dVar82 + dVar82);
    auVar39 = vmulsd_avx512f(local_290,auVar67);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auVar37._0_8_ - auVar30._0_8_;
    auVar37 = vfnmadd213sd_avx512f(auVar39,local_260,auVar62);
    auVar38 = vmulsd_avx512f(auVar29,auVar38);
    auVar37 = vfmadd213sd_fma(auVar38,auVar40,auVar37);
    auVar37 = vfmadd231sd_fma(auVar37,auVar80,auVar58);
    local_150 = auVar37._0_8_;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = 0.0;
    local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = 0.0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_300,5,5,1);
    if ((local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[1] != 2.47032822920623e-323) ||
       (local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[2] != 4.94065645841247e-324)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_300,5,5,1);
    }
    dVar42 = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[0];
    uVar28 = (long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[1] *
             (long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                   m_data.array[2];
    uVar25 = uVar28 + 7;
    if (-1 < (long)uVar28) {
      uVar25 = uVar28;
    }
    uVar27 = uVar25 & 0xfffffffffffffff8;
    if (7 < (long)uVar28) {
      uVar23 = 8;
      if (8 < (long)uVar27) {
        uVar23 = uVar27;
      }
      memcpy((void *)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[0],local_170,uVar23 * 8);
    }
    if ((long)uVar27 < (long)uVar28) {
      lVar26 = (long)uVar25 >> 3;
      memcpy((double *)((long)dVar42 + lVar26 * 8 * 8),local_170 + lVar26 * 8,
             uVar28 * 8 + lVar26 * -0x40);
    }
    math::o4_roots(&local_148,(MatrixXd *)&local_300);
    if ((double *)
        local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0] != (double *)0x0) {
      free(*(void **)((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                            m_storage.m_data.array[0] + -8));
    }
    auVar12._8_8_ = local_360[1];
    auVar12._0_8_ = local_360[0];
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    local_a0 = vxorpd_avx512vl(auVar12,auVar8);
    local_1f8 = (local_a0._0_8_ * (double)local_290._0_8_) / local_378;
    lVar26 = 0;
    local_b0 = 0x8000000000000000;
    uStack_a8 = 0x8000000000000000;
    do {
      local_360[0] = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar26];
      dVar42 = 1.0 - local_360[0] * local_360[0];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar42;
      if (dVar42 < 0.0) {
        auVar50._0_8_ = sqrt(dVar42);
        auVar50._8_56_ = extraout_var_00;
        local_180 = auVar50._0_16_;
      }
      else {
        local_180 = vsqrtsd_avx(auVar44,auVar44);
      }
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_360[0];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_1f8;
      auVar37 = vfnmadd213sd_fma(local_190,auVar63,auVar1);
      auVar37 = vfmadd231sd_fma(auVar37,local_260,local_370);
      local_270 = auVar37._0_8_ /
                  (((local_190._0_8_ * local_360[0] * (double)local_a0._0_8_) / local_378 +
                   (double)local_290._0_8_) - local_260._0_8_);
      auVar45._0_8_ = 1.0 / (local_270 * local_270 + 1.0);
      auVar45._8_8_ = 0;
      if (auVar45._0_8_ < 0.0) {
        auVar51._0_8_ = sqrt(auVar45._0_8_);
        auVar51._8_56_ = extraout_var_01;
        local_280 = auVar51._0_16_;
      }
      else {
        local_280 = vsqrtsd_avx(auVar45,auVar45);
      }
      dVar42 = 1.0 - local_280._0_8_ * local_280._0_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar42;
      if (dVar42 < 0.0) {
        auVar52._0_8_ = sqrt(dVar42);
        auVar52._8_56_ = extraout_var_02;
        auVar37 = auVar52._0_16_;
      }
      else {
        auVar37 = vsqrtsd_avx(auVar46,auVar46);
      }
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_270;
      uVar4 = vcmpsd_avx512f(auVar59,ZEXT816(0),1);
      bVar5 = (bool)((byte)uVar4 & 1);
      auVar41._0_8_ =
           (double)((ulong)bVar5 * (auVar37._0_8_ ^ local_b0) + (ulong)!bVar5 * auVar37._0_8_);
      auVar41._8_8_ = auVar37._8_8_;
      auVar38 = vfmadd213sd_fma(local_370,local_280,auVar41);
      local_270 = auVar38._0_8_;
      local_1e0[1] = local_280._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (double)local_260._0_8_ * auVar41._0_8_ * local_270;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = (double)local_1e0[1] * (double)local_260._0_8_ * local_360[0] * local_270;
      auVar38 = vunpcklpd_avx(auVar57,auVar60);
      local_270 = (double)local_1e0[1] * (double)local_260._0_8_ * (double)local_180._0_8_ *
                  local_270;
      dVar42 = auVar38._0_8_;
      local_70 = dVar42 * local_250;
      dVar53 = auVar38._8_8_;
      dStack_68 = dVar53 * dStack_248;
      auVar20._8_8_ = dStack_238;
      auVar20._0_8_ = local_240;
      local_90 = dVar42 * dStack_238;
      dStack_88 = dVar53 * local_230;
      local_80 = vmovhps_avx(auVar20,local_228);
      local_280._8_8_ = dVar53 * dStack_218;
      local_280._0_8_ = dVar42 * local_220;
      uStack_268 = 0;
      local_1f0 = local_270 * local_210;
      auVar47._0_8_ = (double)((ulong)auVar41._0_8_ ^ local_b0);
      auVar47._8_8_ = auVar37._8_8_ ^ uStack_a8;
      local_1e0[0] = (non_const_type)vmovlpd_avx(auVar47);
      pStack_1c8.data = (double *)(local_360[0] * (double)((ulong)local_1e0[1] ^ local_b0));
      dStack_1b0 = (double)local_180._0_8_ * (double)((ulong)local_1e0[1] ^ local_b0);
      dStack_1c0 = local_360[0] * auVar47._0_8_;
      dStack_1a8 = (double)local_180._0_8_ * auVar47._0_8_;
      pStack_1d0.data = (double *)0x0;
      auVar48._0_8_ = local_180._0_8_ ^ local_b0;
      auVar48._8_8_ = local_180._8_8_ ^ uStack_a8;
      uStack_1b8 = vmovlpd_avx(auVar48);
      local_1a0 = local_360[0];
      local_110.
      super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .m_innerDim = 3;
      local_130.m_dst = (DstEvaluatorType *)&local_1e8;
      local_130.m_src = &local_110;
      local_130.m_functor = &local_379;
      local_1e8.data = (double *)&local_300;
      local_130.m_dstExpr = (DstXprType *)&local_300;
      local_110.
      super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .m_lhs.m_matrix = (non_const_type)&local_250;
      local_110.
      super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .m_rhs.m_matrix = (non_const_type)local_1e0;
      local_110.
      super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .m_lhsImpl.
      super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d
      .data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
               )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                 )&local_250;
      local_110.
      super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      .m_rhsImpl.
      super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d
      .data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
               )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                 )local_1e0;
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
      ::run(&local_130);
      dVar42 = local_270 * (double)local_80._0_8_ + local_70 + dStack_68 + (double)local_c0._0_8_;
      dVar53 = local_270 * (double)local_80._8_8_ + local_90 + dStack_88 + (double)local_c0._8_8_;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [9] = (double)(local_360 + 2);
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [10] = (double)&local_300;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [0xb] = (double)(local_360 + 2);
      local_2a0 = 3;
      auVar16._8_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
      auVar16._0_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
      auVar17._8_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[3];
      auVar17._0_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
      auVar18._8_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
      auVar18._0_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[3];
      auVar19._8_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
      auVar19._0_8_ =
           local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
      auVar37 = vmovhpd_avx(auVar17,local_300.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                                    m_storage.m_data.array[5]);
      lVar24 = 0x10;
      do {
        dVar54 = *(double *)((long)local_360 + lVar24 + 0x10);
        auVar77._8_8_ = dVar54;
        auVar77._0_8_ = dVar54;
        auVar9._8_8_ = *(undefined8 *)((long)local_360 + lVar24);
        auVar9._0_8_ = *(undefined8 *)((long)local_360 + lVar24);
        auVar38 = vmulpd_avx512vl(auVar16,auVar9);
        uVar4 = *(undefined8 *)((long)local_360 + lVar24 + 8);
        auVar10._8_8_ = uVar4;
        auVar10._0_8_ = uVar4;
        auVar38 = vfmadd231pd_avx512vl(auVar38,auVar18,auVar10);
        auVar38 = vfmadd231pd_fma(auVar38,auVar19,auVar77);
        *(undefined1 (*) [16])((long)&local_130.m_functor + lVar24) = auVar38;
        auVar81._0_8_ = auVar37._0_8_ * *(double *)((long)local_360 + lVar24);
        auVar81._8_8_ = auVar37._8_8_ * *(double *)((long)local_360 + lVar24 + 8);
        auVar38 = vshufpd_avx(auVar81,auVar81,1);
        *(double *)
         ((long)&local_110.
                 super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .m_lhs.m_matrix + lVar24) =
             auVar81._0_8_ +
             auVar38._0_8_ +
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[8] * dVar54;
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x58);
      local_1e0[0] = local_110.
                     super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.m_matrix;
      local_1e0[1] = local_110.
                     super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_rhs.m_matrix;
      pStack_1d0.data =
           (double *)
           local_110.
           super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
           .m_lhsImpl.
           super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
           .m_argImpl.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data;
      pStack_1c8.data =
           (double *)
           local_110.
           super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
           .m_rhsImpl.
           super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
           .m_argImpl.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.data;
      dStack_1c0 = (double)local_110.
                           super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           .m_innerDim;
      uStack_1b8 = uStack_e8;
      dStack_1b0 = (double)uStack_e0;
      dStack_1a8 = (double)uStack_d8;
      local_1a0 = (double)local_d0;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [9] = dVar42;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [10] = dVar53;
      local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
      [0xb] = (double)local_280._0_8_ + (double)local_280._8_8_ + local_1f0 + local_208;
      lVar24 = 0x10;
      do {
        uVar4 = *(undefined8 *)((long)&local_1e8.data + lVar24);
        *(undefined8 *)((long)local_310 + lVar24) = *(undefined8 *)((long)&local_1f0 + lVar24);
        *(undefined8 *)((long)local_310 + lVar24 + 8) = uVar4;
        *(undefined8 *)
         ((long)local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                m_data.array + lVar24) = *(undefined8 *)((long)local_1e0 + lVar24);
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x58);
      __position._M_current = *(Matrix<double,_3,_4,_0,_3,_4> **)(local_200 + 8);
      if (__position._M_current == *(Matrix<double,_3,_4,_0,_3,_4> **)(local_200 + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>(local_200,__position,&local_300);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[4] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[4];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[5] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[5];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[6] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[6];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[7] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[7];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[8] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[8];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[9] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[9];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[10] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[10];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[0xb] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[0xb];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[0] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[0];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[1] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[1];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[2] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[2];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[3] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[3];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[4] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[4];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[5] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[5];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[6] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[6];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[7] =
             local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[7];
        *(long *)(local_200 + 8) = *(long *)(local_200 + 8) + 0x60;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 4);
    if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_kneip_main(
    const bearingVectors_t & f,
    const points_t & p,
    transformations_t & solutions )
{
  point_t P1 = p[0];
  point_t P2 = p[1];
  point_t P3 = p[2];

  Eigen::Vector3d temp1 = P2 - P1;
  Eigen::Vector3d temp2 = P3 - P1;

  if( temp1.cross(temp2).norm() == 0)
    return;

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  Eigen::Vector3d e1 = f1;
  Eigen::Vector3d e3 = f1.cross(f2);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  f3 = T*f3;

  if( f3(2,0) > 0)
  {
    f1 = f[1];
    f2 = f[0];
    f3 = f[2];

    e1 = f1;
    e3 = f1.cross(f2);
    e3 = e3/e3.norm();
    e2 = e3.cross(e1);

    T.row(0) = e1.transpose();
    T.row(1) = e2.transpose();
    T.row(2) = e3.transpose();

    f3 = T*f3;

    P1 = p[1];
    P2 = p[0];
    P3 = p[2];
  }

  Eigen::Vector3d n1 = P2-P1;
  n1 = n1/n1.norm();
  Eigen::Vector3d n3 = n1.cross(P3-P1);
  n3 = n3/n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  P3 = N*(P3-P1);

  double d_12 = temp1.norm();
  double f_1 = f3(0,0)/f3(2,0);
  double f_2 = f3(1,0)/f3(2,0);
  double p_1 = P3(0,0);
  double p_2 = P3(1,0);

  double cos_beta = f1.dot(f2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double f_1_pw2 = pow(f_1,2);
  double f_2_pw2 = pow(f_2,2);
  double p_1_pw2 = pow(p_1,2);
  double p_1_pw3 = p_1_pw2 * p_1;
  double p_1_pw4 = p_1_pw3 * p_1;
  double p_2_pw2 = pow(p_2,2);
  double p_2_pw3 = p_2_pw2 * p_2;
  double p_2_pw4 = p_2_pw3 * p_2;
  double d_12_pw2 = pow(d_12,2);
  double b_pw2 = pow(b,2);

  Eigen::Matrix<double,5,1> factors;

  factors(0,0) = -f_2_pw2*p_2_pw4
                 -p_2_pw4*f_1_pw2
                 -p_2_pw4;

  factors(1,0) = 2*p_2_pw3*d_12*b
                 +2*f_2_pw2*p_2_pw3*d_12*b
                 -2*f_2*p_2_pw3*f_1*d_12;

  factors(2,0) = -f_2_pw2*p_2_pw2*p_1_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2*b_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw4
                 +p_2_pw4*f_1_pw2
                 +2*p_1*p_2_pw2*d_12
                 +2*f_1*f_2*p_1*p_2_pw2*d_12*b
                 -p_2_pw2*p_1_pw2*f_1_pw2
                 +2*p_1*p_2_pw2*f_2_pw2*d_12
                 -p_2_pw2*d_12_pw2*b_pw2
                 -2*p_1_pw2*p_2_pw2;

  factors(3,0) = 2*p_1_pw2*p_2*d_12*b
                 +2*f_2*p_2_pw3*f_1*d_12
                 -2*f_2_pw2*p_2_pw3*d_12*b
                 -2*p_1*p_2*d_12_pw2*b;

  factors(4,0) = -2*f_2*p_2_pw2*f_1*p_1*d_12*b
                 +f_2_pw2*p_2_pw2*d_12_pw2
                 +2*p_1_pw3*d_12
                 -p_1_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw2*p_1_pw2
                 -p_1_pw4
                 -2*f_2_pw2*p_2_pw2*p_1*d_12
                 +p_2_pw2*f_1_pw2*p_1_pw2
                 +f_2_pw2*p_2_pw2*d_12_pw2*b_pw2;

  std::vector<double> realRoots = math::o4_roots(factors);

  for( int i = 0; i < 4; i++ )
  {
    double cot_alpha =
        (-f_1*p_1/f_2-realRoots[i]*p_2+d_12*b)/
        (-f_1*realRoots[i]*p_2/f_2+p_1-d_12);

    double cos_theta = realRoots[i];
    double sin_theta = sqrt(1-pow(realRoots[i],2));
    double sin_alpha = sqrt(1/(pow(cot_alpha,2)+1));
    double cos_alpha = sqrt(1-pow(sin_alpha,2));

    if (cot_alpha < 0)
      cos_alpha = -cos_alpha;

    translation_t C;
    C(0,0) = d_12*cos_alpha*(sin_alpha*b+cos_alpha);
    C(1,0) = cos_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);
    C(2,0) = sin_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);

    C = P1 + N.transpose()*C;

    rotation_t R;
    R(0,0) = -cos_alpha;
    R(0,1) = -sin_alpha*cos_theta;
    R(0,2) = -sin_alpha*sin_theta;
    R(1,0) = sin_alpha;
    R(1,1) = -cos_alpha*cos_theta;
    R(1,2) = -cos_alpha*sin_theta;
    R(2,0) = 0.0;
    R(2,1) = -sin_theta;
    R(2,2) = cos_theta;

    R = N.transpose()*R.transpose()*T;

    transformation_t solution;
    solution.col(3) = C;
    solution.block<3,3>(0,0) = R;

    solutions.push_back(solution);
  }
}